

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedNonZeroTest_Test::
~NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedNonZeroTest_Test
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedNonZeroTest_Test *this)

{
  (this->super_NoFieldPresenceSwapFieldTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceSwapFieldTest_0190ebd0;
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x590);
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest, ReflectionSwapFieldRepeatedNonZeroTest) {
  m1_.add_repeated_int32(1);
  m2_.add_repeated_int32(2);
  m2_.add_repeated_int32(22);

  const FieldDescriptor* f = FindFieldByName("repeated_int32");
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_EQ(r1_->FieldSize(m1_, f), 2);
  EXPECT_EQ(r2_->FieldSize(m2_, f), 1);
  EXPECT_THAT(m1_.repeated_int32(), UnorderedPointwise(Eq(), {2, 22}));
  EXPECT_THAT(m2_.repeated_int32(), UnorderedPointwise(Eq(), {1}));

  // It doesn't matter which reflection or descriptor gets used; swapping should
  // still work if m2_'s descriptor is provided.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped again.
  EXPECT_EQ(r1_->FieldSize(m1_, f), 1);
  EXPECT_EQ(r2_->FieldSize(m2_, f), 2);
  EXPECT_THAT(m1_.repeated_int32(), UnorderedPointwise(Eq(), {1}));
  EXPECT_THAT(m2_.repeated_int32(), UnorderedPointwise(Eq(), {2, 22}));
}